

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  FuncTypeModuleField *pFVar1;
  Index IVar2;
  FuncTypeModuleField *local_40;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_38;
  
  if (decl->has_func_type == false) {
    IVar2 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar2 == 0xffffffff) {
      MakeUnique<wabt::FuncTypeModuleField,wabt::Location_const&>((wabt *)&local_40,loc);
      pFVar1 = local_40;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(local_40->func_type).sig.param_types,&(decl->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(pFVar1->func_type).sig.result_types,&(decl->sig).result_types);
      local_38._M_head_impl = local_40;
      local_40 = (FuncTypeModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                                  *)&local_38);
      if (local_38._M_head_impl != (FuncTypeModuleField *)0x0) {
        (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_38._M_head_impl = (FuncTypeModuleField *)0x0;
      if (local_40 != (FuncTypeModuleField *)0x0) {
        (**(code **)(*(long *)local_40 + 8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<FuncTypeModuleField>(loc);
      func_type_field->func_type.sig = decl.sig;
      module->AppendField(std::move(func_type_field));
    }
  }
}